

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzer.cpp
# Opt level: O2

AnalyzerChannelData * __thiscall SMBusAnalyzer::AdvanceAllTo(SMBusAnalyzer *this,U64 toSample)

{
  uint __line;
  ulong uVar1;
  AnalyzerChannelData *pAVar2;
  char *__assertion;
  
  uVar1 = AnalyzerChannelData::GetSampleNumber();
  if (toSample < uVar1) {
    __assertion = "mSMBCLK->GetSampleNumber() <= toSample";
    __line = 0x22;
  }
  else {
    uVar1 = AnalyzerChannelData::GetSampleNumber();
    if (uVar1 <= toSample) {
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mSMBCLK);
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mSMBDAT);
      pAVar2 = GetNearestTransitionChannel(this);
      return pAVar2;
    }
    __assertion = "mSMBDAT->GetSampleNumber() <= toSample";
    __line = 0x23;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]smbus-analyzer/src/SMBusAnalyzer.cpp"
                ,__line,"AnalyzerChannelData *SMBusAnalyzer::AdvanceAllTo(U64)");
}

Assistant:

AnalyzerChannelData* SMBusAnalyzer::AdvanceAllTo( U64 toSample )
{
    assert( mSMBCLK->GetSampleNumber() <= toSample );
    assert( mSMBDAT->GetSampleNumber() <= toSample );

    mSMBCLK->AdvanceToAbsPosition( toSample );
    mSMBDAT->AdvanceToAbsPosition( toSample );

    return GetNearestTransitionChannel();
}